

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserPOMDPFormat_Spirit.cpp
# Opt level: O1

void __thiscall
POMDPFormatParsing::ParserPOMDPFormat_Spirit::ProcessR::operator()
          (ProcessR *this,iterator_t *str,iterator_t end)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ParserPOMDPFormat_Spirit *pPVar5;
  uint *puVar6;
  iterator iVar7;
  pointer puVar8;
  POMDPDiscrete *pPVar9;
  pointer puVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ostream *poVar14;
  undefined8 *puVar15;
  pointer puVar16;
  pointer puVar17;
  pointer puVar18;
  pointer puVar19;
  pointer puVar20;
  pointer local_1e8;
  uint local_1b8 [4];
  ostream local_1a8 [376];
  
  pPVar5 = this->_m_po;
  if (pPVar5->_m_lp_type != DOUBLE) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"ProcessR:last parsed type should be a double. (at ",0x32);
    poVar14 = POMDPFormatParsing::operator<<(local_1a8,&str->_pos);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,")",1);
    std::endl<char,std::char_traits<char>>(poVar14);
    puVar15 = (undefined8 *)__cxa_allocate_exception(0x28);
    *puVar15 = &PTR__E_0059bd80;
    std::__cxx11::stringbuf::str();
    __cxa_throw(puVar15,&E::typeinfo,E::~E);
  }
  if ((long)(pPVar5->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(pPVar5->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start != 4) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"ProcessR: _m_lp_fromSI has size != 1. (at ",0x2a);
    poVar14 = POMDPFormatParsing::operator<<(local_1a8,&str->_pos);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,")",1);
    std::endl<char,std::char_traits<char>>(poVar14);
    puVar15 = (undefined8 *)__cxa_allocate_exception(0x28);
    *puVar15 = &PTR__E_0059bd80;
    std::__cxx11::stringbuf::str();
    __cxa_throw(puVar15,&E::typeinfo,E::~E);
  }
  if ((long)(pPVar5->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(pPVar5->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start != 4) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"ProcessR: _m_lp_toSI has size != 1. (at ",0x28);
    poVar14 = POMDPFormatParsing::operator<<(local_1a8,&str->_pos);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,")",1);
    std::endl<char,std::char_traits<char>>(poVar14);
    puVar15 = (undefined8 *)__cxa_allocate_exception(0x28);
    *puVar15 = &PTR__E_0059bd80;
    std::__cxx11::stringbuf::str();
    __cxa_throw(puVar15,&E::typeinfo,E::~E);
  }
  dVar1 = pPVar5->_m_lp_double;
  uVar11 = (**(code **)(*(long *)&(pPVar5->_m_decPOMDPDiscrete->super_DecPOMDPDiscrete).
                                  super_MultiAgentDecisionProcessDiscrete.
                                  super_MultiAgentDecisionProcess + 0x30))();
  pPVar5 = this->_m_po;
  uVar2 = *(pPVar5->_m_lp_JOI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar3 = pPVar5->_m_anyStateIndex;
  if ((*(pPVar5->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
        .super__Vector_impl_data._M_start == uVar3) && (uVar2 == pPVar5->_m_anyJOIndex)) {
    puVar6 = (pPVar5->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (*puVar6 == uVar3) {
      if ((pPVar5->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish != puVar6) {
        (pPVar5->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = puVar6;
      }
      local_1b8[0] = 0;
      if (uVar11 != 0) {
        uVar12 = 0;
        do {
          pPVar5 = this->_m_po;
          iVar7._M_current =
               (pPVar5->_m_lp_fromSI).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar7._M_current ==
              (pPVar5->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pPVar5->_m_lp_fromSI,
                       iVar7,local_1b8);
          }
          else {
            *iVar7._M_current = (uint)uVar12;
            (pPVar5->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish = iVar7._M_current + 1;
          }
          local_1b8[0] = local_1b8[0] + 1;
          uVar12 = (ulong)local_1b8[0];
        } while (uVar12 < uVar11);
      }
    }
    puVar8 = (this->_m_po->_m_lp_fromSI).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar20 = (this->_m_po->_m_lp_fromSI).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start; puVar20 != puVar8; puVar20 = puVar20 + 1) {
      puVar16 = (this->_m_po->_m_lp_JAI).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar18 = (this->_m_po->_m_lp_JAI).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (puVar16 != puVar18) {
        uVar2 = *puVar20;
        do {
          pPVar9 = this->_m_po->_m_decPOMDPDiscrete;
          (**(code **)(*(long *)&(pPVar9->super_DecPOMDPDiscrete).
                                 super_MultiAgentDecisionProcessDiscrete.
                                 super_MultiAgentDecisionProcess + 0x180))
                    (dVar1,pPVar9,uVar2,*puVar16);
          puVar16 = puVar16 + 1;
        } while (puVar16 != puVar18);
      }
    }
  }
  else {
    puVar6 = (pPVar5->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (uVar2 == pPVar5->_m_anyJOIndex) {
      if (*puVar6 == uVar3) {
        if ((pPVar5->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish != puVar6) {
          (pPVar5->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar6;
        }
        local_1b8[0] = 0;
        lVar13 = (**(code **)(*(long *)&(this->_m_po->_m_decPOMDPDiscrete->super_DecPOMDPDiscrete).
                                        super_MultiAgentDecisionProcessDiscrete.
                                        super_MultiAgentDecisionProcess + 0x30))();
        if (lVar13 != 0) {
          do {
            pPVar5 = this->_m_po;
            iVar7._M_current =
                 (pPVar5->_m_lp_fromSI).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar7._M_current ==
                (pPVar5->_m_lp_fromSI).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pPVar5->_m_lp_fromSI,
                         iVar7,local_1b8);
            }
            else {
              *iVar7._M_current = local_1b8[0];
              (pPVar5->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
              ._M_impl.super__Vector_impl_data._M_finish = iVar7._M_current + 1;
            }
            local_1b8[0] = local_1b8[0] + 1;
            uVar12 = (ulong)local_1b8[0];
            uVar11 = (**(code **)(*(long *)&(this->_m_po->_m_decPOMDPDiscrete->
                                            super_DecPOMDPDiscrete).
                                            super_MultiAgentDecisionProcessDiscrete.
                                            super_MultiAgentDecisionProcess + 0x30))();
          } while (uVar12 < uVar11);
        }
      }
      puVar8 = (this->_m_po->_m_lp_fromSI).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar20 = (this->_m_po->_m_lp_fromSI).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start; puVar20 != puVar8; puVar20 = puVar20 + 1) {
        puVar16 = (this->_m_po->_m_lp_JAI).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar18 = (this->_m_po->_m_lp_JAI).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (puVar16 != puVar18) {
          uVar2 = *puVar20;
          do {
            puVar17 = (this->_m_po->_m_lp_toSI).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            puVar19 = (this->_m_po->_m_lp_toSI).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if (puVar17 != puVar19) {
              uVar3 = *puVar16;
              do {
                pPVar9 = this->_m_po->_m_decPOMDPDiscrete;
                (**(code **)(*(long *)&(pPVar9->super_DecPOMDPDiscrete).
                                       super_MultiAgentDecisionProcessDiscrete.
                                       super_MultiAgentDecisionProcess + 0x188))
                          (dVar1,pPVar9,uVar2,uVar3,*puVar17);
                puVar17 = puVar17 + 1;
              } while (puVar17 != puVar19);
            }
            puVar16 = puVar16 + 1;
          } while (puVar16 != puVar18);
        }
      }
    }
    else {
      if (*puVar6 == uVar3) {
        if ((pPVar5->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish != puVar6) {
          (pPVar5->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar6;
        }
        local_1b8[0] = 0;
        lVar13 = (**(code **)(*(long *)&(this->_m_po->_m_decPOMDPDiscrete->super_DecPOMDPDiscrete).
                                        super_MultiAgentDecisionProcessDiscrete.
                                        super_MultiAgentDecisionProcess + 0x30))();
        if (lVar13 != 0) {
          do {
            pPVar5 = this->_m_po;
            iVar7._M_current =
                 (pPVar5->_m_lp_fromSI).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar7._M_current ==
                (pPVar5->_m_lp_fromSI).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pPVar5->_m_lp_fromSI,
                         iVar7,local_1b8);
            }
            else {
              *iVar7._M_current = local_1b8[0];
              (pPVar5->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
              ._M_impl.super__Vector_impl_data._M_finish = iVar7._M_current + 1;
            }
            local_1b8[0] = local_1b8[0] + 1;
            uVar12 = (ulong)local_1b8[0];
            uVar11 = (**(code **)(*(long *)&(this->_m_po->_m_decPOMDPDiscrete->
                                            super_DecPOMDPDiscrete).
                                            super_MultiAgentDecisionProcessDiscrete.
                                            super_MultiAgentDecisionProcess + 0x30))();
          } while (uVar12 < uVar11);
        }
      }
      pPVar5 = this->_m_po;
      puVar20 = (pPVar5->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (*puVar20 == pPVar5->_m_anyStateIndex) {
        if ((pPVar5->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish != puVar20) {
          (pPVar5->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar20;
        }
        local_1b8[0] = 0;
        lVar13 = (**(code **)(*(long *)&(this->_m_po->_m_decPOMDPDiscrete->super_DecPOMDPDiscrete).
                                        super_MultiAgentDecisionProcessDiscrete.
                                        super_MultiAgentDecisionProcess + 0x30))();
        if (lVar13 != 0) {
          do {
            pPVar5 = this->_m_po;
            iVar7._M_current =
                 (pPVar5->_m_lp_toSI).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar7._M_current ==
                (pPVar5->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pPVar5->_m_lp_toSI,
                         iVar7,local_1b8);
            }
            else {
              *iVar7._M_current = local_1b8[0];
              (pPVar5->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar7._M_current + 1;
            }
            local_1b8[0] = local_1b8[0] + 1;
            uVar12 = (ulong)local_1b8[0];
            uVar11 = (**(code **)(*(long *)&(this->_m_po->_m_decPOMDPDiscrete->
                                            super_DecPOMDPDiscrete).
                                            super_MultiAgentDecisionProcessDiscrete.
                                            super_MultiAgentDecisionProcess + 0x30))();
          } while (uVar12 < uVar11);
        }
      }
      puVar8 = (this->_m_po->_m_lp_JOI).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar20 = (this->_m_po->_m_lp_JOI).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start; puVar20 != puVar8; puVar20 = puVar20 + 1) {
        local_1e8 = (this->_m_po->_m_lp_fromSI).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        puVar16 = (this->_m_po->_m_lp_fromSI).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (local_1e8 != puVar16) {
          uVar2 = *puVar20;
          do {
            puVar18 = (this->_m_po->_m_lp_JAI).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            puVar17 = (this->_m_po->_m_lp_JAI).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if (puVar18 != puVar17) {
              uVar3 = *local_1e8;
              do {
                puVar19 = (this->_m_po->_m_lp_toSI).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                puVar10 = (this->_m_po->_m_lp_toSI).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish;
                if (puVar19 != puVar10) {
                  uVar4 = *puVar18;
                  do {
                    pPVar9 = this->_m_po->_m_decPOMDPDiscrete;
                    (**(code **)(*(long *)&(pPVar9->super_DecPOMDPDiscrete).
                                           super_MultiAgentDecisionProcessDiscrete.
                                           super_MultiAgentDecisionProcess + 400))
                              (dVar1,pPVar9,uVar3,uVar4,*puVar19,uVar2);
                    puVar19 = puVar19 + 1;
                  } while (puVar19 != puVar10);
                }
                puVar18 = puVar18 + 1;
              } while (puVar18 != puVar17);
            }
            local_1e8 = local_1e8 + 1;
          } while (local_1e8 != puVar16);
        }
      }
    }
  }
  return;
}

Assistant:

void ParserPOMDPFormat_Spirit::ProcessR::operator()(iterator_t str, iterator_t end) const
{
    if(_m_po->_m_lp_type != DOUBLE)
    {
        stringstream ss; ss<<"ProcessR:last parsed type should be a double. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }
    double reward = _m_po->_m_lp_double;
    if(        _m_po-> _m_lp_fromSI.size() != 1 )
    {
        stringstream ss; ss<<"ProcessR: _m_lp_fromSI has size != 1. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }   
    if(        _m_po-> _m_lp_toSI.size() != 1 )
    {
        stringstream ss; ss<<"ProcessR: _m_lp_toSI has size != 1. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }    
    size_t nrS =  _m_po->GetPOMDPDiscrete()->GetNrStates();
    //size_t nrJO = _m_po->GetPOMDPDiscrete()->GetNrJointObservations();
    Index sucSI = _m_po-> _m_lp_toSI[0];
    Index joI = _m_po->_m_lp_JOI[0];
    if( sucSI == _m_po->_m_anyStateIndex && joI == _m_po->_m_anyJOIndex) 
    {
        // rewards of the form R: ja : s : * : * : %f, so we can simply do
        // AddReward()
    
        if(_m_po->_m_lp_fromSI[0] == _m_po->_m_anyStateIndex)
        {
            _m_po->_m_lp_fromSI.clear();
            for(Index si=0; si < nrS; si++)
                _m_po->_m_lp_fromSI.push_back(si);
        }            
        
        vector<Index>::iterator sI_it = _m_po->_m_lp_fromSI.begin();
        vector<Index>::iterator sI_last = _m_po->_m_lp_fromSI.end();
        while(sI_it != sI_last)
        {
            Index sI = *sI_it;
            vector<Index>::iterator jaI_it = _m_po->_m_lp_JAI.begin();
            vector<Index>::iterator jaI_last = _m_po->_m_lp_JAI.end();
            while(jaI_it != jaI_last)
            {
                Index jaI = *jaI_it;
                _m_po->GetPOMDPDiscrete()->SetReward(sI, jaI, reward);
                if(DEBUG_POMDP_PARSE)
                    cout << "Setting R("<<sI<<","<<jaI<<") = "<<reward<<endl;
                jaI_it++;
            }
            sI_it++;
        }
    }    
    else if( joI == _m_po->_m_anyJOIndex ) //but end-state is not ANY_INDEX
    {
        if( _m_po->_m_lp_fromSI[0] == _m_po->_m_anyStateIndex )
        {
            _m_po->_m_lp_fromSI.clear();
            for(Index si=0; si < _m_po->GetPOMDPDiscrete()->GetNrStates();si++)
                _m_po->_m_lp_fromSI.push_back(si);
        }
/*        Obsolete test...
        if( sucSI == ANY_INDEX )
        {
            _m_po->_m_lp_toSI.clear();
            for(Index si=0; si < _m_po->GetPOMDPDiscrete()->GetNrStates();si++)
                _m_po->_m_lp_toSI.push_back(si);
        }*/
        vector<Index>::iterator sI_it = _m_po->_m_lp_fromSI.begin();
        vector<Index>::iterator sI_last = _m_po->_m_lp_fromSI.end();
        while(sI_it != sI_last)
        {
            Index sI = *sI_it;
            vector<Index>::iterator jaI_it = _m_po->_m_lp_JAI.begin();
            vector<Index>::iterator jaI_last = _m_po->_m_lp_JAI.end();
            while(jaI_it != jaI_last)
            {
                Index jaI = *jaI_it;
                vector<Index>::iterator sucSI_it = _m_po->_m_lp_toSI.begin();
                vector<Index>::iterator sucSI_last = _m_po->_m_lp_toSI.end();
                while(sucSI_it != sucSI_last)
                {
                    sucSI = *sucSI_it; 
                    _m_po->GetPOMDPDiscrete()->SetReward(sI, jaI, sucSI, reward);
                    if(DEBUG_POMDP_PARSE)
                        cout << "Setting R("<<sI<<","<<jaI<<","<<sucSI<<") = "<<
                            reward<<endl;
                    sucSI_it++;
                }
                jaI_it++;
            }
            sI_it++;
        }

    }
    else // both end-state and joI are specified. joI != ANY_INDEX
         // (otherwise it would fall under previous else if )
    {

        if( _m_po->_m_lp_fromSI[0] == _m_po->_m_anyStateIndex )
        {
            _m_po->_m_lp_fromSI.clear();
            for(Index si=0; si < _m_po->GetPOMDPDiscrete()->GetNrStates();si++)
                _m_po->_m_lp_fromSI.push_back(si);
        }
        if( _m_po->_m_lp_toSI[0] == _m_po->_m_anyStateIndex )
        {
            _m_po->_m_lp_toSI.clear();
            for(Index si=0; si < _m_po->GetPOMDPDiscrete()->GetNrStates();si++)
                _m_po->_m_lp_toSI.push_back(si);
        }
        vector<Index>::iterator joI_it = _m_po->_m_lp_JOI.begin();
        vector<Index>::iterator joI_last = _m_po->_m_lp_JOI.end();
        while(joI_it != joI_last)
        {
            joI = *joI_it;
            vector<Index>::iterator sI_it = _m_po->_m_lp_fromSI.begin();
            vector<Index>::iterator sI_last = _m_po->_m_lp_fromSI.end();
            while(sI_it != sI_last)
            {
                Index sI = *sI_it;
                vector<Index>::iterator jaI_it = _m_po->_m_lp_JAI.begin();
                vector<Index>::iterator jaI_last = _m_po->_m_lp_JAI.end();
                while(jaI_it != jaI_last)
                {
                    Index jaI = *jaI_it;
                    vector<Index>::iterator sucSI_it = _m_po->_m_lp_toSI.begin();
                    vector<Index>::iterator sucSI_last = _m_po->_m_lp_toSI.end();
                    while(sucSI_it != sucSI_last)
                    {
                        sucSI = *sucSI_it; 
                        _m_po->GetPOMDPDiscrete()->SetReward(sI, jaI, sucSI,joI, 
                            reward);
                        if(DEBUG_POMDP_PARSE)
                            cout << "Setting R("<<sI<<","<<jaI<<","<<sucSI<<
                                ","<<joI<<") = "<<reward<<endl;
                        sucSI_it++;
                    }
                    jaI_it++;
                }
                sI_it++;
            }
            joI_it++;
        }
    } //end else (both end-state and joI are specified)
}